

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.h
# Opt level: O0

bool __thiscall woff2::Buffer::ReadU32(Buffer *this,uint32_t *value)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t *value_local;
  Buffer *this_local;
  
  bVar1 = this->offset_ + 4 <= this->length_;
  if (bVar1) {
    *value = *(uint32_t *)(this->buffer_ + this->offset_);
    uVar2 = ntohl(*value);
    *value = uVar2;
    this->offset_ = this->offset_ + 4;
  }
  return bVar1;
}

Assistant:

bool ReadU32(uint32_t *value) {
    if (offset_ + 4 > length_) {
      return FONT_COMPRESSION_FAILURE();
    }
    std::memcpy(value, buffer_ + offset_, sizeof(uint32_t));
    *value = ntohl(*value);
    offset_ += 4;
    return true;
  }